

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O0

string * __thiscall
google::protobuf::UnknownFieldSet::AddLengthDelimited_abi_cxx11_(UnknownFieldSet *this,int number)

{
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *this_00;
  string *this_01;
  undefined1 local_28 [8];
  UnknownField field;
  int number_local;
  UnknownFieldSet *this_local;
  
  field.field_2.varint_._4_4_ = number;
  if (this->fields_ ==
      (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *)0x0
     ) {
    this_00 = (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
               *)operator_new(0x18);
    std::vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>::
    vector(this_00);
    this->fields_ = this_00;
  }
  local_28._0_4_ = field.field_2.varint_._4_4_ & 0x1fffffff | 0x60000000;
  this_01 = (string *)operator_new(0x20);
  std::__cxx11::string::string(this_01);
  field._0_8_ = this_01;
  std::vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>::
  push_back(this->fields_,(value_type *)local_28);
  return (string *)field._0_8_;
}

Assistant:

string* UnknownFieldSet::AddLengthDelimited(int number) {
  if (fields_ == NULL) fields_ = new vector<UnknownField>;
  UnknownField field;
  field.number_ = number;
  field.type_ = UnknownField::TYPE_LENGTH_DELIMITED;
  field.length_delimited_.string_value_ = new string;
  fields_->push_back(field);
  return field.length_delimited_.string_value_;
}